

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

int fy_resolve_merge_key_populate(fy_document *fyd,fy_node *fyn,fy_node_pair *fynp,fy_node *fynm)

{
  undefined1 *puVar1;
  list_head *plVar2;
  fy_node_pair *pfVar3;
  list_head *value;
  fy_node *pfVar4;
  int iVar5;
  fy_token *pfVar6;
  char *fmt;
  
  if (((fyn->field_0x34 & 3) == 2) && ((fynm->field_0x34 & 3) == 2)) {
    pfVar6 = (fynm->field_12).scalar;
    iVar5 = 0;
    if (pfVar6 != (fy_token *)0x0 && pfVar6 != (fy_token *)&fynm->field_12) {
      do {
        pfVar3 = fy_node_mapping_lookup_pair(fyn,*(fy_node **)&pfVar6->type);
        if (pfVar3 == (fy_node_pair *)0x0) {
          value = (list_head *)malloc(0x30);
          if (value == (list_head *)0x0) {
            fmt = "fy_node_pair_alloc() failed";
            iVar5 = 0x9fd;
            goto LAB_00124f9e;
          }
          value[1].next = (list_head *)0x0;
          value[1].prev = (list_head *)0x0;
          value[2].next = &fyd->node;
          if (fyd == (fy_document *)0x0) {
LAB_00124f34:
            pfVar4 = (fy_node *)0x0;
          }
          else {
            pfVar4 = fy_node_copy_internal(fyd,*(fy_node **)&pfVar6->type,(fy_node *)0x0);
            if (pfVar4 == (fy_node *)0x0) {
              puVar1 = &fyd->diag->field_0x3c;
              *puVar1 = *puVar1 & 0xfe;
            }
            value[1].next = &pfVar4->node;
            pfVar4 = fy_node_copy_internal(fyd,*(fy_node **)&pfVar6->analyze_flags,(fy_node *)0x0);
            if (pfVar4 == (fy_node *)0x0) {
              puVar1 = &fyd->diag->field_0x3c;
              *puVar1 = *puVar1 & 0xfe;
              goto LAB_00124f34;
            }
          }
          value[1].prev = &pfVar4->node;
          plVar2 = (fynp->node).next;
          plVar2->prev = value;
          value->next = plVar2;
          value->prev = &fynp->node;
          (fynp->node).next = value;
          if (fyn->xl != (fy_accel *)0x0) {
            fy_accel_insert(fyn->xl,value[1].next,value);
          }
        }
        pfVar6 = (fy_token *)(pfVar6->node).next;
        iVar5 = 0;
      } while ((pfVar6 != (fy_token *)&fynm->field_12) && (iVar5 = 0, pfVar6 != (fy_token *)0x0));
    }
  }
  else {
    fmt = "bad inputs to %s";
    iVar5 = 0x9f2;
LAB_00124f9e:
    fy_document_diag(fyd,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,iVar5,"fy_resolve_merge_key_populate",fmt);
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

static int fy_resolve_merge_key_populate(struct fy_document *fyd, struct fy_node *fyn,
                                         struct fy_node_pair *fynp, struct fy_node *fynm) {
    struct fy_node_pair *fynpi, *fynpn;

    if (!fyd)
        return -1;

    fyd_error_check(fyd,
                    fyn && fynp && fynm && fyn->type == FYNT_MAPPING && fynm->type == FYNT_MAPPING,
                    err_out, "bad inputs to %s", __func__);

    for (fynpi = fy_node_pair_list_head(&fynm->mapping); fynpi;
         fynpi = fy_node_pair_next(&fynm->mapping, fynpi)) {

        /* make sure we don't override an already existing key */
        if (fy_node_mapping_key_is_duplicate(fyn, fynpi->key))
            continue;

        fynpn = fy_node_pair_alloc(fyd);
        fyd_error_check(fyd, fynpn, err_out,
                        "fy_node_pair_alloc() failed");

        fynpn->key = fy_node_copy(fyd, fynpi->key);
        fynpn->value = fy_node_copy(fyd, fynpi->value);

        fy_node_pair_list_insert_after(&fyn->mapping, fynp, fynpn);
        if (fyn->xl)
            fy_accel_insert(fyn->xl, fynpn->key, fynpn);
    }

    return 0;

    err_out:
    return -1;
}